

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_redraw_section(wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2)

{
  wchar_t *pwVar1;
  wchar_t *c_ptr;
  wchar_t j;
  wchar_t i;
  wchar_t y2_local;
  wchar_t x2_local;
  wchar_t y1_local;
  wchar_t x1_local;
  
  j = y2;
  if (Term->hgt <= y2) {
    j = Term->hgt + L'\xffffffff';
  }
  i = x2;
  if (Term->wid <= x2) {
    i = Term->wid + L'\xffffffff';
  }
  y2_local = y1;
  if (y1 < L'\0') {
    y2_local = L'\0';
  }
  x2_local = x1;
  if (x1 < L'\0') {
    x2_local = L'\0';
  }
  Term->y1 = y2_local;
  Term->y2 = j;
  for (c_ptr._4_4_ = Term->y1; c_ptr._4_4_ <= Term->y2; c_ptr._4_4_ = c_ptr._4_4_ + 1) {
    if ((L'\0' < x2_local) && (Term->old->a[c_ptr._4_4_][x2_local] == 0xff)) {
      x2_local = x2_local + L'\xffffffff';
    }
    Term->x1[c_ptr._4_4_] = x2_local;
    Term->x2[c_ptr._4_4_] = i;
    pwVar1 = Term->old->c[c_ptr._4_4_];
    for (c_ptr._0_4_ = x2_local; (wchar_t)c_ptr <= i; c_ptr._0_4_ = (wchar_t)c_ptr + L'\x01') {
      pwVar1[(wchar_t)c_ptr] = L'\0';
    }
  }
  Term_fresh();
  return 0;
}

Assistant:

errr Term_redraw_section(int x1, int y1, int x2, int y2)
{
	int i, j;

	wchar_t *c_ptr;

	/* Bounds checking */
	if (y2 >= Term->hgt) y2 = Term->hgt - 1;
	if (x2 >= Term->wid) x2 = Term->wid - 1;
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;


	/* Set y limits */
	Term->y1 = y1;
	Term->y2 = y2;

	/* Set the x limits */
	for (i = Term->y1; i <= Term->y2; i++) {
		if ((x1 > 0) && (Term->old->a[i][x1] == 255))
			x1--;

		Term->x1[i] = x1;
		Term->x2[i] = x2;

		c_ptr = Term->old->c[i];

		/* Clear the section so it is redrawn */
		for (j = x1; j <= x2; j++) {
			/* Hack - set the old character to "none" */
			c_ptr[j] = 0;
		}
	}

	/* Hack -- Refresh */
	Term_fresh();

	/* Success */
	return (0);
}